

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O0

void __thiscall cmRST::ProcessRST(cmRST *this,istream *is)

{
  bool bVar1;
  undefined1 local_38 [8];
  string line;
  istream *is_local;
  cmRST *this_local;
  
  line.field_2._8_8_ = is;
  std::__cxx11::string::string((string *)local_38);
  while( true ) {
    bVar1 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)line.field_2._8_8_,(string *)local_38,(bool *)0x0,
                       0xffffffffffffffff);
    if (!bVar1) break;
    ProcessLine(this,(string *)local_38);
  }
  Reset(this);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmRST::ProcessRST(std::istream& is)
{
  std::string line;
  while (cmSystemTools::GetLineFromStream(is, line)) {
    this->ProcessLine(line);
  }
  this->Reset();
}